

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O3

optional_idx __thiscall
duckdb::FunctionBinder::BindFunctionCost
          (FunctionBinder *this,SimpleFunction *func,vector<duckdb::LogicalType,_true> *arguments)

{
  pointer pLVar1;
  pointer pLVar2;
  bool bVar3;
  optional_idx oVar4;
  const_reference pvVar5;
  CastFunctionSet *this_00;
  const_reference target;
  int64_t iVar6;
  size_type __n;
  idx_t index;
  optional_idx local_38;
  
  if ((func->varargs).id_ != INVALID) {
    oVar4 = BindVarArgsFunctionCost(this,func,arguments);
    return (optional_idx)oVar4.index;
  }
  pLVar1 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  oVar4.index = 0xffffffffffffffff;
  if ((long)(func->arguments).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(func->arguments).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start == (long)pLVar2 - (long)pLVar1) {
    if (pLVar2 == pLVar1) {
      index = 0;
    }
    else {
      index = 0;
      __n = 0;
      bVar3 = false;
      do {
        pvVar5 = vector<duckdb::LogicalType,_true>::operator[](arguments,__n);
        if (pvVar5->id_ == UNKNOWN) {
          bVar3 = true;
        }
        else {
          this_00 = CastFunctionSet::Get(this->context);
          pvVar5 = vector<duckdb::LogicalType,_true>::operator[](arguments,__n);
          target = vector<duckdb::LogicalType,_true>::operator[](&func->arguments,__n);
          iVar6 = CastFunctionSet::ImplicitCastCost(this_00,pvVar5,target);
          if (iVar6 < 0) {
            return (optional_idx)0xffffffffffffffff;
          }
          index = index + iVar6;
        }
        __n = __n + 1;
      } while (__n < (ulong)(((long)(arguments->
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ).
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(arguments->
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ).
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
      if (bVar3) {
        return (optional_idx)0;
      }
    }
    optional_idx::optional_idx(&local_38,index);
    oVar4.index = local_38.index;
  }
  return (optional_idx)oVar4.index;
}

Assistant:

optional_idx FunctionBinder::BindFunctionCost(const SimpleFunction &func, const vector<LogicalType> &arguments) {
	if (func.HasVarArgs()) {
		// special case varargs function
		return BindVarArgsFunctionCost(func, arguments);
	}
	if (func.arguments.size() != arguments.size()) {
		// invalid argument count: check the next function
		return optional_idx();
	}
	idx_t cost = 0;
	bool has_parameter = false;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i].id() == LogicalTypeId::UNKNOWN) {
			has_parameter = true;
			continue;
		}
		int64_t cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(arguments[i], func.arguments[i]);
		if (cast_cost >= 0) {
			// we can implicitly cast, add the cost to the total cost
			cost += idx_t(cast_cost);
		} else {
			// we can't implicitly cast: throw an error
			return optional_idx();
		}
	}
	if (has_parameter) {
		// all arguments are implicitly castable and there is a parameter - return 0 as cost
		return 0;
	}
	return cost;
}